

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# units.cpp
# Opt level: O1

string * __thiscall
units::probeUnitBase_abi_cxx11_
          (string *__return_storage_ptr__,units *this,precise_unit *un,
          pair<units::precise_unit,_const_char_*> *probe)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  double dVar2;
  byte bVar3;
  pointer pcVar4;
  long lVar5;
  bool bVar6;
  bool bVar7;
  unit_data uVar8;
  long *plVar9;
  undefined8 *puVar10;
  size_type *psVar11;
  long *plVar12;
  undefined1 extraout_DL;
  undefined1 extraout_DL_00;
  undefined1 numOnly;
  bool numOnly_00;
  ulong uVar13;
  ulong *puVar14;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar15;
  ulong uVar16;
  precise_unit pVar17;
  string prefix;
  __string_type __str;
  unit base;
  string beststr;
  string fnd;
  size_t cut;
  unit in_stack_fffffffffffffe48;
  string local_1a8;
  ulong *local_188;
  ulong local_180;
  ulong local_178;
  undefined8 uStack_170;
  undefined8 local_168;
  double local_160;
  char *local_158;
  size_type local_150;
  char local_148;
  undefined7 uStack_147;
  undefined8 uStack_140;
  ulong *local_138;
  long local_130;
  ulong local_128;
  undefined8 uStack_120;
  long *local_118;
  long local_110;
  long local_108 [2];
  ulong *local_f8;
  long local_f0;
  ulong local_e8 [2];
  long *local_d8;
  long local_d0;
  long local_c8;
  long lStack_c0;
  size_t local_b8;
  string local_b0;
  string local_90;
  string local_70;
  string local_50;
  
  local_150 = 0;
  local_148 = '\0';
  dVar2 = *(double *)this;
  local_160 = un->multiplier_;
  local_158 = &local_148;
  uVar8 = detail::unit_data::operator*((unit_data *)(this + 8),&un->base_units_);
  local_168 = CONCAT44(uVar8,0x3f800000);
  find_unit_abi_cxx11_(in_stack_fffffffffffffe48);
  dVar2 = dVar2 * local_160;
  if (local_110 == 0) {
LAB_001ee6e8:
    local_160 = (double)CONCAT44(local_160._4_4_,(undefined4)local_168);
    detail::unit_data::inv((unit_data *)((long)&local_168 + 4));
    find_unit_abi_cxx11_(in_stack_fffffffffffffe48);
    std::__cxx11::string::operator=((string *)&local_118,(string *)&local_1a8);
    numOnly = extraout_DL;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1a8._M_dataplus._M_p != &local_1a8.field_2) {
      operator_delete(local_1a8._M_dataplus._M_p,local_1a8.field_2._M_allocated_capacity + 1);
      numOnly = extraout_DL_00;
    }
    if (local_110 != 0) {
      getMultiplierString_abi_cxx11_
                (&local_1a8,
                 (units *)(ulong)((byte)(*(char *)((long)local_118 + local_110 + -1) - 0x30U) < 10),
                 1.0 / dVar2,(bool)numOnly);
      paVar15 = &__return_storage_ptr__->field_2;
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)paVar15;
      std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,"1/(","");
      std::__cxx11::string::_M_append
                ((char *)__return_storage_ptr__,(ulong)local_1a8._M_dataplus._M_p);
      std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)local_118);
      std::__cxx11::string::push_back((char)__return_storage_ptr__);
      std::__cxx11::string::append((char *)__return_storage_ptr__);
      std::__cxx11::string::push_back((char)__return_storage_ptr__);
      bVar6 = true;
      if (local_1a8._M_string_length == 0) {
        bVar7 = false;
      }
      else {
        bVar3 = *local_1a8._M_dataplus._M_p;
        if (9 < (byte)(bVar3 - 0x30)) {
          bVar7 = false;
          if ((0x2e < bVar3) ||
             (bVar7 = false, (0x680000000000U >> ((ulong)(uint)bVar3 & 0x3f) & 1) == 0))
          goto LAB_001ee86d;
        }
        bVar7 = true;
        if (__return_storage_ptr__->_M_string_length <= local_150 - 1) {
          std::__cxx11::string::operator=((string *)&local_158,(string *)__return_storage_ptr__);
        }
        bVar6 = false;
      }
LAB_001ee86d:
      if ((!bVar6) &&
         (pcVar4 = (__return_storage_ptr__->_M_dataplus)._M_p,
         (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
          *)pcVar4 != paVar15)) {
        operator_delete(pcVar4,paVar15->_M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1a8._M_dataplus._M_p != &local_1a8.field_2) {
        operator_delete(local_1a8._M_dataplus._M_p,local_1a8.field_2._M_allocated_capacity + 1);
      }
      if (!bVar7) goto LAB_001eefc4;
    }
    paVar15 = &local_1a8.field_2;
    pVar17 = precise_unit::operator/((precise_unit *)this,un);
    local_168 = pVar17._8_8_ << 0x20 | 0x3f800000;
    find_unit_abi_cxx11_(in_stack_fffffffffffffe48);
    std::__cxx11::string::operator=((string *)&local_118,(string *)&local_1a8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1a8._M_dataplus._M_p != paVar15) {
      operator_delete(local_1a8._M_dataplus._M_p,local_1a8.field_2._M_allocated_capacity + 1);
    }
    if (local_110 == 0) {
LAB_001eea99:
      local_160 = (double)CONCAT44(local_160._4_4_,(undefined4)local_168);
      detail::unit_data::inv((unit_data *)((long)&local_168 + 4));
      find_unit_abi_cxx11_(in_stack_fffffffffffffe48);
      std::__cxx11::string::operator=((string *)&local_118,(string *)&local_1a8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1a8._M_dataplus._M_p != paVar15) {
        operator_delete(local_1a8._M_dataplus._M_p,local_1a8.field_2._M_allocated_capacity + 1);
      }
      if (local_110 != 0) {
        local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_b0,local_118,local_110 + (long)local_118);
        generateUnitSequence(&local_1a8,1.0 / pVar17.multiplier_,&local_b0);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
          operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
        }
        bVar3 = *local_1a8._M_dataplus._M_p;
        uVar16 = 1;
        if (9 < (byte)(bVar3 - 0x30)) {
          if (bVar3 < 0x2f) {
            uVar16 = 0x680000000000 >> (bVar3 & 0x3f);
          }
          else {
            uVar16 = 0;
          }
        }
        if ((uVar16 & 1) == 0) {
          std::__cxx11::string::string
                    ((string *)&local_138,(char *)un[1].multiplier_,(allocator *)&local_d8);
          puVar10 = (undefined8 *)std::__cxx11::string::append((char *)&local_138);
          puVar14 = puVar10 + 2;
          if ((ulong *)*puVar10 == puVar14) {
            local_178 = *puVar14;
            uStack_170 = puVar10[3];
            local_188 = &local_178;
          }
          else {
            local_178 = *puVar14;
            local_188 = (ulong *)*puVar10;
          }
          local_180 = puVar10[1];
          *puVar10 = puVar14;
          puVar10[1] = 0;
          *(undefined1 *)(puVar10 + 2) = 0;
          plVar9 = (long *)std::__cxx11::string::_M_append
                                     ((char *)&local_188,(ulong)local_1a8._M_dataplus._M_p);
          (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
          psVar11 = (size_type *)(plVar9 + 2);
          if ((size_type *)*plVar9 == psVar11) {
            lVar5 = plVar9[3];
            (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar11;
            *(long *)((long)&__return_storage_ptr__->field_2 + 8) = lVar5;
          }
          else {
            (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)*plVar9;
            (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar11;
          }
          __return_storage_ptr__->_M_string_length = plVar9[1];
          *plVar9 = (long)psVar11;
          plVar9[1] = 0;
          *(undefined1 *)(plVar9 + 2) = 0;
          if (local_188 != &local_178) {
            operator_delete(local_188,local_178 + 1);
          }
          uVar13 = local_128;
          puVar14 = local_138;
          if (local_138 != &local_128) goto LAB_001eef5d;
        }
        else {
          local_b8 = 0;
          dVar2 = getDoubleFromString(&local_1a8,&local_b8);
          getMultiplierString_abi_cxx11_(&local_50,(units *)0x1,1.0 / dVar2,numOnly_00);
          plVar9 = (long *)std::__cxx11::string::append((char *)&local_50);
          plVar12 = plVar9 + 2;
          if ((long *)*plVar9 == plVar12) {
            local_c8 = *plVar12;
            lStack_c0 = plVar9[3];
            local_d8 = &local_c8;
          }
          else {
            local_c8 = *plVar12;
            local_d8 = (long *)*plVar9;
          }
          local_d0 = plVar9[1];
          *plVar9 = (long)plVar12;
          plVar9[1] = 0;
          *(undefined1 *)(plVar9 + 2) = 0;
          puVar10 = (undefined8 *)std::__cxx11::string::append((char *)&local_d8);
          puVar14 = puVar10 + 2;
          if ((ulong *)*puVar10 == puVar14) {
            local_128 = *puVar14;
            uStack_120 = puVar10[3];
            local_138 = &local_128;
          }
          else {
            local_128 = *puVar14;
            local_138 = (ulong *)*puVar10;
          }
          local_130 = puVar10[1];
          *puVar10 = puVar14;
          puVar10[1] = 0;
          *(undefined1 *)(puVar10 + 2) = 0;
          std::__cxx11::string::substr((ulong)&local_f8,(ulong)&local_1a8);
          uVar13 = 0xf;
          if (local_138 != &local_128) {
            uVar13 = local_128;
          }
          if (uVar13 < (ulong)(local_f0 + local_130)) {
            uVar13 = 0xf;
            if (local_f8 != local_e8) {
              uVar13 = local_e8[0];
            }
            if (uVar13 < (ulong)(local_f0 + local_130)) goto LAB_001eede7;
            puVar10 = (undefined8 *)
                      std::__cxx11::string::replace((ulong)&local_f8,0,(char *)0x0,(ulong)local_138)
            ;
          }
          else {
LAB_001eede7:
            puVar10 = (undefined8 *)
                      std::__cxx11::string::_M_append((char *)&local_138,(ulong)local_f8);
          }
          local_188 = &local_178;
          puVar14 = puVar10 + 2;
          if ((ulong *)*puVar10 == puVar14) {
            local_178 = *puVar14;
            uStack_170 = puVar10[3];
          }
          else {
            local_178 = *puVar14;
            local_188 = (ulong *)*puVar10;
          }
          local_180 = puVar10[1];
          *puVar10 = puVar14;
          puVar10[1] = 0;
          *(undefined1 *)puVar14 = 0;
          if (local_f8 != local_e8) {
            operator_delete(local_f8,local_e8[0] + 1);
          }
          if (local_138 != &local_128) {
            operator_delete(local_138,local_128 + 1);
          }
          if (local_d8 != &local_c8) {
            operator_delete(local_d8,local_c8 + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_50._M_dataplus._M_p != &local_50.field_2) {
            operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
          }
          if (local_180 <= local_150 - 1) {
            std::__cxx11::string::_M_assign((string *)&local_158);
          }
          uVar13 = local_178;
          puVar14 = local_188;
          if (local_188 != &local_178) {
LAB_001eef5d:
            operator_delete(puVar14,uVar13 + 1);
          }
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1a8._M_dataplus._M_p != paVar15) {
          operator_delete(local_1a8._M_dataplus._M_p,local_1a8.field_2._M_allocated_capacity + 1);
        }
        if ((uVar16 & 1) == 0) goto LAB_001eefc4;
      }
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      if (local_158 == &local_148) {
        (__return_storage_ptr__->field_2)._M_allocated_capacity = CONCAT71(uStack_147,local_148);
        *(undefined8 *)((long)&__return_storage_ptr__->field_2 + 8) = uStack_140;
      }
      else {
        (__return_storage_ptr__->_M_dataplus)._M_p = local_158;
        (__return_storage_ptr__->field_2)._M_allocated_capacity = CONCAT71(uStack_147,local_148);
      }
      __return_storage_ptr__->_M_string_length = local_150;
      local_150 = 0;
      local_148 = '\0';
      local_158 = &local_148;
      goto LAB_001eefc4;
    }
    local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_90,local_118,local_110 + (long)local_118);
    generateUnitSequence(&local_1a8,pVar17.multiplier_,&local_90);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_90._M_dataplus._M_p != &local_90.field_2) {
      operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
    }
    local_188 = &local_178;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_188,local_1a8._M_dataplus._M_p,
               local_1a8._M_dataplus._M_p + local_1a8._M_string_length);
    std::__cxx11::string::_M_replace_aux((ulong)&local_188,local_180,0,'\x01');
    plVar9 = (long *)std::__cxx11::string::append((char *)&local_188);
    paVar1 = &__return_storage_ptr__->field_2;
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)paVar1;
    psVar11 = (size_type *)(plVar9 + 2);
    if ((size_type *)*plVar9 == psVar11) {
      lVar5 = plVar9[3];
      paVar1->_M_allocated_capacity = *psVar11;
      *(long *)((long)&__return_storage_ptr__->field_2 + 8) = lVar5;
    }
    else {
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)*plVar9;
      (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar11;
    }
    __return_storage_ptr__->_M_string_length = plVar9[1];
    *plVar9 = (long)psVar11;
    plVar9[1] = 0;
    *(undefined1 *)(plVar9 + 2) = 0;
    if (local_188 != &local_178) {
      operator_delete(local_188,local_178 + 1);
    }
    bVar3 = *(__return_storage_ptr__->_M_dataplus)._M_p;
    uVar16 = 1;
    if (9 < (byte)(bVar3 - 0x30)) {
      if (bVar3 < 0x2f) {
        uVar16 = 0x680000000000 >> (bVar3 & 0x3f);
      }
      else {
        uVar16 = 0;
      }
    }
    if ((uVar16 & 1) != 0) {
      if (__return_storage_ptr__->_M_string_length <= local_150 - 1) {
        std::__cxx11::string::_M_assign((string *)&local_158);
      }
      if ((uVar16 & 1) != 0) {
        pcVar4 = (__return_storage_ptr__->_M_dataplus)._M_p;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)pcVar4 != paVar1) {
          operator_delete(pcVar4,paVar1->_M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1a8._M_dataplus._M_p != paVar15) {
          operator_delete(local_1a8._M_dataplus._M_p,local_1a8.field_2._M_allocated_capacity + 1);
        }
        goto LAB_001eea99;
      }
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1a8._M_dataplus._M_p == paVar15) goto LAB_001eefc4;
  }
  else {
    local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_70,local_118,local_110 + (long)local_118);
    generateUnitSequence(&local_1a8,dVar2,&local_70);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p != &local_70.field_2) {
      operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
    }
    local_188 = &local_178;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_188,local_1a8._M_dataplus._M_p,
               local_1a8._M_dataplus._M_p + local_1a8._M_string_length);
    std::__cxx11::string::_M_replace_aux((ulong)&local_188,local_180,0,'\x01');
    plVar9 = (long *)std::__cxx11::string::append((char *)&local_188);
    paVar15 = &__return_storage_ptr__->field_2;
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)paVar15;
    psVar11 = (size_type *)(plVar9 + 2);
    if ((size_type *)*plVar9 == psVar11) {
      lVar5 = plVar9[3];
      paVar15->_M_allocated_capacity = *psVar11;
      *(long *)((long)&__return_storage_ptr__->field_2 + 8) = lVar5;
    }
    else {
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)*plVar9;
      (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar11;
    }
    __return_storage_ptr__->_M_string_length = plVar9[1];
    *plVar9 = (long)psVar11;
    plVar9[1] = 0;
    *(undefined1 *)(plVar9 + 2) = 0;
    if (local_188 != &local_178) {
      operator_delete(local_188,local_178 + 1);
    }
    bVar3 = *(__return_storage_ptr__->_M_dataplus)._M_p;
    uVar16 = 1;
    if (9 < (byte)(bVar3 - 0x30)) {
      if (bVar3 < 0x2f) {
        uVar16 = 0x680000000000 >> (bVar3 & 0x3f);
      }
      else {
        uVar16 = 0;
      }
    }
    if ((uVar16 & 1) != 0) {
      if (__return_storage_ptr__->_M_string_length <= local_150 - 1) {
        std::__cxx11::string::_M_assign((string *)&local_158);
      }
      if ((uVar16 & 1) != 0) {
        pcVar4 = (__return_storage_ptr__->_M_dataplus)._M_p;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)pcVar4 != paVar15) {
          operator_delete(pcVar4,paVar15->_M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1a8._M_dataplus._M_p != &local_1a8.field_2) {
          operator_delete(local_1a8._M_dataplus._M_p,local_1a8.field_2._M_allocated_capacity + 1);
        }
        goto LAB_001ee6e8;
      }
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1a8._M_dataplus._M_p == &local_1a8.field_2) goto LAB_001eefc4;
  }
  operator_delete(local_1a8._M_dataplus._M_p,local_1a8.field_2._M_allocated_capacity + 1);
LAB_001eefc4:
  if (local_118 != local_108) {
    operator_delete(local_118,local_108[0] + 1);
  }
  if (local_158 != &local_148) {
    operator_delete(local_158,CONCAT71(uStack_147,local_148) + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

static std::string probeUnitBase(
    const precise_unit& un,
    const std::pair<precise_unit, const char*>& probe)
{
    std::string beststr;
    // let's try common divisor units on base units
    auto ext = un * probe.first;
    auto base = unit(ext.base_units());
    auto fnd = find_unit(base);
    if (!fnd.empty()) {
        auto prefix = generateUnitSequence(ext.multiplier(), fnd);

        auto str = prefix + '/' + probe.second;
        if (!isNumericalStartCharacter(str.front())) {
            return str;
        }
        if (beststr.empty() || str.size() < beststr.size()) {
            beststr = str;
        }
    }
    // let's try inverse of common multiplier units on base units
    fnd = find_unit(base.inv());
    if (!fnd.empty()) {
        auto prefix = getMultiplierString(
            1.0 / ext.multiplier(), isDigitCharacter(fnd.back()));
        std::string str{"1/("};
        str += prefix;
        str += fnd;
        str.push_back('*');
        str.append(probe.second);
        str.push_back(')');
        if (prefix.empty() || !isNumericalStartCharacter(prefix.front())) {
            return str;
        }
        if (beststr.empty() || str.size() < beststr.size()) {
            beststr = std::move(str);
        }
    }
    // let's try common multiplier units on base units
    ext = un / probe.first;
    base = unit(ext.base_units());
    fnd = find_unit(base);
    if (!fnd.empty()) {
        auto prefix = generateUnitSequence(ext.multiplier(), fnd);
        auto str = prefix + '*' + probe.second;
        if (!isNumericalStartCharacter(str.front())) {
            return str;
        }
        if (beststr.empty() || str.size() < beststr.size()) {
            beststr = str;
        }
    }
    // let's try common divisor with inv units on base units
    fnd = find_unit(base.inv());
    if (!fnd.empty()) {
        auto prefix = generateUnitSequence(1.0 / ext.multiplier(), fnd);
        if (isNumericalStartCharacter(prefix.front())) {
            size_t cut{0};
            double mx = getDoubleFromString(prefix, &cut);

            auto str = getMultiplierString(1.0 / mx, true) + probe.second +
                "/" + prefix.substr(cut);
            if (beststr.empty() || str.size() < beststr.size()) {
                beststr = str;
            }

        } else {
            return std::string(probe.second) + "/" + prefix;
        }
    }
    return beststr;
}